

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O1

void cvui::internal::resetRenderingBuffer(cvui_block_t *theScreen)

{
  (theScreen->rect).x = 0;
  (theScreen->rect).y = 0;
  (theScreen->rect).width = 0;
  (theScreen->rect).height = 0;
  (theScreen->fill).x = 0;
  (theScreen->fill).y = (theScreen->rect).y;
  (theScreen->fill).width = 0;
  (theScreen->fill).height = 0;
  (theScreen->anchor).x = 0;
  (theScreen->anchor).y = 0;
  theScreen->padding = 0;
  return;
}

Assistant:

void resetRenderingBuffer(cvui_block_t& theScreen) {
		theScreen.rect.x = 0;
		theScreen.rect.y = 0;
		theScreen.rect.width = 0;
		theScreen.rect.height = 0;

		theScreen.fill = theScreen.rect;
		theScreen.fill.width = 0;
		theScreen.fill.height = 0;

		theScreen.anchor.x = 0;
		theScreen.anchor.y = 0;

		theScreen.padding = 0;
	}